

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O1

void __thiscall SPTest_MultipleRealizations_Test::TestBody(SPTest_MultipleRealizations_Test *this)

{
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
  *this_00;
  pointer pdVar1;
  pointer pdVar2;
  bool bVar3;
  Impl *pIVar4;
  Impl *pIVar5;
  int iVar6;
  undefined4 uVar7;
  char *pcVar8;
  CallExprBuilder CVar9;
  AssertionResult gtest_ar;
  SPAdapter sp;
  TestBasicProblem p;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_630;
  AssertHelper local_628;
  internal local_620 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_618;
  SPAdapter local_610;
  undefined1 local_3c8 [16];
  pointer local_3b8;
  undefined **local_390;
  pointer local_70;
  pointer local_60;
  pointer local_58;
  pointer local_48;
  pointer local_40;
  pointer local_30;
  
  TestBasicProblem::TestBasicProblem((TestBasicProblem *)local_3c8,2,0);
  CVar9 = TestProblem::BeginRandom((TestProblem *)local_3c8,4);
  pIVar4 = CVar9.impl_;
  iVar6 = CVar9.arg_index_;
  this_00 = (vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
             *)(local_3c8 + 8);
  local_610.problem_ = (ColProblem *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(this_00,(Impl **)&local_610);
  pIVar5 = (Impl *)operator_new__(0x40);
  pIVar5->kind_ = FIRST_REFERENCE;
  local_3b8[-1] = pIVar5;
  pIVar5[1].kind_ = UNKNOWN;
  pIVar4->args[iVar6] = pIVar5;
  local_610.problem_ = (ColProblem *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(this_00,(Impl **)&local_610);
  pIVar5 = (Impl *)operator_new__(0x80);
  pIVar5->kind_ = FIRST_EXPR;
  local_3b8[-1] = pIVar5;
  *(undefined8 *)(pIVar5 + 2) = 0x4026000000000000;
  pIVar4->args[iVar6 + 1] = pIVar5;
  local_610.problem_ = (ColProblem *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(this_00,(Impl **)&local_610);
  pIVar5 = (Impl *)operator_new__(0x80);
  pIVar5->kind_ = FIRST_EXPR;
  local_3b8[-1] = pIVar5;
  *(undefined8 *)(pIVar5 + 2) = 0x4036000000000000;
  pIVar4->args[iVar6 + 2] = pIVar5;
  local_610.problem_ = (ColProblem *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>(this_00,(Impl **)&local_610);
  pIVar5 = (Impl *)operator_new__(0x80);
  pIVar5->kind_ = FIRST_EXPR;
  local_3b8[-1] = pIVar5;
  *(undefined8 *)(pIVar5 + 2) = 0x4040800000000000;
  pIVar4->args[iVar6 + 3] = pIVar5;
  CVar9.arg_index_ = iVar6 + 4;
  CVar9.impl_ = pIVar4;
  CVar9._12_4_ = 0;
  TestProblem::EndRandom((TestProblem *)local_3c8,CVar9);
  mp::SPAdapter::SPAdapter(&local_610,(ColProblem *)local_3c8);
  local_628.data_._0_4_ = 1;
  local_630.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)local_610.rvs_.
               super__Vector_base<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_610.rvs_.
               super__Vector_base<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
               ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_620,"1","sp.num_rvs()",(int *)&local_628,(unsigned_long *)&local_630);
  if (local_620[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_630);
    if (local_618.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_618.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_628,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0xce,
               pcVar8);
    testing::internal::AssertHelper::operator=(&local_628,(Message *)&local_630);
    testing::internal::AssertHelper::~AssertHelper(&local_628);
    if (local_630.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_630.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_630.ptr_ + 8))();
      }
      local_630.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_630.ptr_._0_4_ = 3;
  local_628.data_._0_4_ =
       (undefined4)
       ((ulong)((long)((local_610.rvs_.
                        super__Vector_base<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
                        ._M_impl.super__Vector_impl_data._M_start)->probabilities_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)((local_610.rvs_.
                       super__Vector_base<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
                       ._M_impl.super__Vector_impl_data._M_start)->probabilities_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 3);
  testing::internal::CmpHelperEQ<int,int>
            (local_620,"3","sp.rv(0).num_realizations()",(int *)&local_630,(int *)&local_628);
  if (local_620[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_630);
    if (local_618.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_618.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_628,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0xcf,
               pcVar8);
    testing::internal::AssertHelper::operator=(&local_628,(Message *)&local_630);
    testing::internal::AssertHelper::~AssertHelper(&local_628);
    if (local_630.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_630.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_630.ptr_ + 8))();
      }
      local_630.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  uVar7 = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_630.ptr_._0_4_ = 1;
  pdVar1 = ((local_610.rvs_.
             super__Vector_base<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
             ._M_impl.super__Vector_impl_data._M_start)->probabilities_).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = ((local_610.rvs_.
             super__Vector_base<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
             ._M_impl.super__Vector_impl_data._M_start)->probabilities_).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar1 != pdVar2) {
    uVar7 = (undefined4)
            ((ulong)((long)((local_610.rvs_.
                             super__Vector_base<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
                             ._M_impl.super__Vector_impl_data._M_start)->data_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)((local_610.rvs_.
                             super__Vector_base<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
                             ._M_impl.super__Vector_impl_data._M_start)->data_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) /
            (ulong)((long)pdVar2 - (long)pdVar1 >> 3));
  }
  local_628.data_._0_4_ = uVar7;
  testing::internal::CmpHelperEQ<int,int>
            (local_620,"1","sp.rv(0).num_elements()",(int *)&local_630,(int *)&local_628);
  if (local_620[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_630);
    if (local_618.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_618.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_628,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0xd0,
               pcVar8);
    testing::internal::AssertHelper::operator=(&local_628,(Message *)&local_630);
    testing::internal::AssertHelper::~AssertHelper(&local_628);
    if (local_630.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_630.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_630.ptr_ + 8))();
      }
      local_630.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_618,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::SPAdapter::~SPAdapter(&local_610);
  local_3c8._0_8_ = &PTR__ColProblem_00199678;
  local_390 = &PTR__ColProblem_00199698;
  if (local_40 != (pointer)0x0) {
    operator_delete(local_40,(long)local_30 - (long)local_40);
  }
  if (local_58 != (pointer)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  if (local_70 != (pointer)0x0) {
    operator_delete(local_70,(long)local_60 - (long)local_70);
  }
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)local_3c8);
  return;
}

Assistant:

TEST(SPTest, MultipleRealizations) {
  TestBasicProblem p(2);
  auto random = p.BeginRandom(4);
  random.AddArg(p.MakeVariable(0));
  random.AddArg(p.MakeNumericConstant(11));
  random.AddArg(p.MakeNumericConstant(22));
  random.AddArg(p.MakeNumericConstant(33));
  p.EndRandom(random);
  mp::SPAdapter sp(p);
  EXPECT_EQ(1, sp.num_rvs());
  EXPECT_EQ(3, sp.rv(0).num_realizations());
  EXPECT_EQ(1, sp.rv(0).num_elements());
}